

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  float fVar4;
  int *piVar5;
  pointer pOVar6;
  char cVar7;
  int iVar8;
  float fVar9;
  size_t sVar10;
  long lVar11;
  float fVar12;
  ulong uVar13;
  long lVar14;
  __m128 t_2;
  __m128 t;
  int baseLine;
  Extractor ex;
  vector<Object,_std::allocator<Object>_> objects;
  float mean_vals [3];
  Size label_size;
  Mat local_278;
  float norm_vals [3];
  float local_220;
  int local_21c;
  value_type local_218;
  undefined8 uStack_200;
  Mat image;
  undefined4 local_1f0;
  int iStack_1ec;
  Allocator *local_1d8;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net yolov2;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar3,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov2);
    if ((Allocator **)yolov2._vptr_Net != &yolov2.opt.blob_allocator) {
      operator_delete(yolov2._vptr_Net);
    }
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      yolov2.opt.use_vulkan_compute = true;
      iVar8 = ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      if ((iVar8 != 0) || (iVar8 = ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin"), iVar8 != 0))
      {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,2,local_18c,local_190,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      local_278.cstep = 0;
      local_278.data = (size_t *)0x0;
      local_278.refcount._0_4_ = 0;
      local_278.refcount._4_4_ = 0;
      local_278.elemsize._0_4_ = 0;
      local_278.elemsize._4_4_ = 0;
      local_278.elempack = 0;
      local_278.allocator = (Allocator *)0x0;
      local_278.dims = 0;
      local_278.w = 0;
      local_278.h = 0;
      local_278.d = 0;
      local_278.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_278,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < local_278.h) {
        lVar14 = 0;
        do {
          lVar11 = local_278.w * lVar14 *
                   CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
          local_218.prob = *(float *)((long)local_278.data + lVar11 + 4);
          local_218.label = (int)*(float *)((long)local_278.data + lVar11);
          local_218.rect.x = *(float *)((long)local_278.data + lVar11 + 8) * (float)local_18c;
          local_218.rect.y = *(float *)((long)local_278.data + lVar11 + 0xc) * (float)local_190;
          local_218.rect.height =
               *(float *)((long)local_278.data + lVar11 + 0x14) * (float)local_190 -
               local_218.rect.y;
          local_218.rect.width =
               *(float *)((long)local_278.data + lVar11 + 0x10) * (float)local_18c -
               local_218.rect.x;
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,&local_218);
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_278.h);
      }
      piVar5 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
            if ((size_t *)local_278.data != (size_t *)0x0) {
              free(local_278.data);
            }
          }
          else {
            (*(local_278.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar5 = (int *)CONCAT44(iStack_1ec,local_1f0);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            if (_image != (Net *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          pOVar6 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar14),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar14),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar14),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar14),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar14),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar14
                                  ));
          local_278.elemsize._0_4_ = 0;
          local_278.elemsize._4_4_ = 0;
          local_278.data = (void *)CONCAT44(local_278.data._4_4_,0x3010000);
          auVar2 = *(undefined1 (*) [16])((long)&(pOVar6->rect).x + lVar14);
          mean_vals[2] = (float)(int)ROUND(auVar2._8_4_);
          mean_vals[1] = (float)(int)ROUND(auVar2._4_4_);
          mean_vals[0] = (float)(int)ROUND(auVar2._0_4_);
          yolov2._vptr_Net = (_func_int **)0x406fe00000000000;
          yolov2.opt.workspace_allocator = (Allocator *)0x0;
          yolov2.opt.lightmode = false;
          yolov2.opt._1_3_ = 0;
          yolov2.opt.num_threads = 0;
          yolov2.opt.blob_allocator = (Allocator *)0x0;
          local_278.refcount = (int *)&image;
          cv::rectangle(&local_278,mean_vals,&yolov2,1,8,0);
          sprintf((char *)&yolov2,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar6->prob + lVar14) * 100.0),0),
                  (long)*(int *)((long)&DAT_005131c4 +
                                (long)*(int *)((long)&pOVar6->label + lVar14) * 4 + 4) + 0x5131c8);
          local_278.data = &local_278.elemsize;
          sVar10 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,&yolov2,(long)&yolov2._vptr_Net + sVar10);
          cv::getTextSize((string *)&label_size,(int)&local_278,0.5,0,(int *)0x1);
          if ((size_t *)local_278.data != &local_278.elemsize) {
            operator_delete(local_278.data);
          }
          fVar9 = (float)(int)*(float *)((long)&(pOVar6->rect).x + lVar14);
          fVar12 = (float)(int)((*(float *)((long)&(pOVar6->rect).y + lVar14) -
                                (float)label_size.height) - 0.0);
          if ((int)fVar12 < 1) {
            fVar12 = 0.0;
          }
          fVar4 = (float)(iStack_1ec - label_size.width);
          if (label_size.width + (int)fVar9 <= iStack_1ec) {
            fVar4 = fVar9;
          }
          ex._vptr_Extractor._0_4_ = 0x3010000;
          norm_vals[1] = fVar12;
          norm_vals[0] = fVar4;
          norm_vals[2] = (float)label_size.width;
          local_278.data = (void *)0x406fe00000000000;
          local_278.refcount._0_4_ = 0;
          local_278.refcount._4_4_ = 0x406fe000;
          local_278.elemsize._0_4_ = 0;
          local_278.elemsize._4_4_ = 0x406fe000;
          local_278.elempack = 0;
          local_278._28_4_ = 0;
          ex.d = (ExtractorPrivate *)&image;
          cv::rectangle(&ex,norm_vals,&local_278,0xffffffff,8,0);
          ex._vptr_Extractor._0_4_ = 0x3010000;
          ex.d = (ExtractorPrivate *)&image;
          local_278.data = &local_278.elemsize;
          sVar10 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,&yolov2,(long)&yolov2._vptr_Net + sVar10);
          local_21c = (int)fVar12 + label_size.height;
          local_218.rect.x = 0.0;
          local_218.rect.y = 0.0;
          local_218.rect.width = 0.0;
          local_218.rect.height = 0.0;
          local_218.label = 0;
          local_218.prob = 0.0;
          uStack_200 = 0;
          local_220 = fVar4;
          cv::putText(0,&ex,&local_278,&local_220,0,&local_218,1,8,0);
          if ((size_t *)local_278.data != &local_278.elemsize) {
            operator_delete(local_278.data);
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x18;
        } while (uVar13 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_278.refcount = (int *)&image;
      ppAVar1 = &yolov2.opt.blob_allocator;
      yolov2.opt.blob_allocator =
           (Allocator *)CONCAT26(yolov2.opt.blob_allocator._6_2_,0x6567616d69);
      yolov2.opt.lightmode = true;
      yolov2.opt._1_3_ = 0;
      yolov2.opt.num_threads = 0;
      local_278.elemsize._0_4_ = 0;
      local_278.elemsize._4_4_ = 0;
      local_278.data = (void *)CONCAT44(local_278.data._4_4_,0x1010000);
      yolov2._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&yolov2,(_InputArray *)&local_278);
      if ((Allocator **)yolov2._vptr_Net != ppAVar1) {
        operator_delete(yolov2._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar8 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar8 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov2(m, objects);

    draw_objects(m, objects);

    return 0;
}